

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O1

qlonglong __thiscall ProString::toLongLong(ProString *this,bool *ok,int base)

{
  CutResult CVar1;
  qlonglong qVar2;
  char16_t *pcVar3;
  long lVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  long local_30;
  long local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (this->m_string).d.ptr;
  local_28 = (long)this->m_offset;
  local_30 = (long)this->m_length;
  CVar1 = QtPrivate::QContainerImplHelper::mid((this->m_string).d.size,&local_28,&local_30);
  if (CVar1 == Null) {
    lVar4 = 0;
    pcVar3 = (char16_t *)0x0;
  }
  else {
    pcVar3 = pcVar3 + local_28;
    lVar4 = local_30;
  }
  QVar5.m_data = pcVar3;
  QVar5.m_size = lVar4;
  qVar2 = QString::toIntegral_helper(QVar5,ok,base);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return qVar2;
  }
  __stack_chk_fail();
}

Assistant:

qlonglong toLongLong(bool *ok = nullptr, int base = 10) const { return toQStringView().toLongLong(ok, base); }